

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_set.cpp
# Opt level: O1

BoundStatement * __thiscall
duckdb::Binder::Bind(BoundStatement *__return_storage_ptr__,Binder *this,SetStatement *stmt)

{
  SetVariableStatement *stmt_00;
  ResetVariableStatement *stmt_01;
  NotImplementedException *this_00;
  string local_40;
  
  if (stmt->set_type == RESET) {
    stmt_01 = SQLStatement::Cast<duckdb::ResetVariableStatement>(&stmt->super_SQLStatement);
    Bind(__return_storage_ptr__,this,stmt_01);
  }
  else {
    if (stmt->set_type != SET) {
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Type not implemented for SetType","");
      NotImplementedException::NotImplementedException(this_00,&local_40);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    stmt_00 = SQLStatement::Cast<duckdb::SetVariableStatement>(&stmt->super_SQLStatement);
    Bind(__return_storage_ptr__,this,stmt_00);
  }
  return __return_storage_ptr__;
}

Assistant:

BoundStatement Binder::Bind(SetStatement &stmt) {
	switch (stmt.set_type) {
	case SetType::SET: {
		auto &set_stmt = stmt.Cast<SetVariableStatement>();
		return Bind(set_stmt);
	}
	case SetType::RESET: {
		auto &set_stmt = stmt.Cast<ResetVariableStatement>();
		return Bind(set_stmt);
	}
	default:
		throw NotImplementedException("Type not implemented for SetType");
	}
}